

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctflt.c
# Opt level: O1

void jpeg_fdct_float(float *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  
  uVar11 = (ulong)start_col;
  lVar12 = 0;
  do {
    lVar10 = *(long *)((long)sample_data + lVar12);
    bVar6 = *(byte *)(lVar10 + 7 + uVar11);
    iVar18 = (uint)bVar6 + (uint)*(byte *)(lVar10 + uVar11);
    iVar13 = (uint)*(byte *)(lVar10 + uVar11) - (uint)bVar6;
    fVar21 = (float)iVar13;
    bVar6 = *(byte *)(lVar10 + 1 + uVar11);
    bVar7 = *(byte *)(lVar10 + 6 + uVar11);
    iVar14 = (uint)bVar7 + (uint)bVar6;
    iVar15 = (uint)bVar6 - (uint)bVar7;
    bVar6 = *(byte *)(lVar10 + 2 + uVar11);
    bVar7 = *(byte *)(lVar10 + 5 + uVar11);
    bVar8 = *(byte *)(lVar10 + 3 + uVar11);
    bVar9 = *(byte *)(lVar10 + 4 + uVar11);
    iVar19 = (uint)bVar9 + (uint)bVar8;
    iVar17 = iVar19 + iVar18;
    iVar18 = iVar18 - iVar19;
    iVar20 = (uint)bVar7 + (uint)bVar6;
    fVar26 = (float)iVar18;
    iVar16 = (uint)bVar6 - (uint)bVar7;
    iVar19 = iVar20 + iVar14;
    data[lVar12] = (float)(iVar19 + iVar17 + -0x400);
    data[lVar12 + 4] = (float)(iVar17 - iVar19);
    fVar31 = (float)((iVar14 - iVar20) + iVar18) * 0.70710677;
    iVar17 = ((uint)bVar8 - (uint)bVar9) + iVar16;
    iVar13 = iVar15 + iVar13;
    data[lVar12 + 2] = fVar31 + fVar26;
    fVar52 = (float)(iVar17 - iVar13) * 0.38268343;
    fVar42 = (float)iVar17 * 0.5411961 + fVar52;
    fVar52 = (float)iVar13 * 1.306563 + fVar52;
    fVar47 = (float)(iVar16 + iVar15) * 0.70710677;
    fVar36 = fVar47 + fVar21;
    fVar21 = fVar21 - fVar47;
    data[lVar12 + 5] = fVar21 + fVar42;
    data[lVar12 + 3] = fVar21 - fVar42;
    data[lVar12 + 1] = fVar36 + fVar52;
    *(ulong *)(data + lVar12 + 6) = CONCAT44(fVar36 - fVar52,fVar26 - fVar31);
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x40);
  lVar12 = -8;
  do {
    pfVar4 = data + lVar12 + 0x40;
    pfVar1 = data + lVar12 + 8;
    pfVar2 = data + lVar12 + 0x10;
    pfVar3 = data + lVar12 + 0x18;
    pfVar5 = data + lVar12 + 0x20;
    fVar21 = *pfVar5;
    fVar26 = pfVar5[1];
    fVar31 = pfVar5[2];
    fVar52 = pfVar5[3];
    fVar37 = *pfVar1 + *pfVar4;
    fVar38 = pfVar1[1] + pfVar4[1];
    fVar39 = pfVar1[2] + pfVar4[2];
    fVar40 = pfVar1[3] + pfVar4[3];
    fVar27 = *pfVar1 - *pfVar4;
    fVar28 = pfVar1[1] - pfVar4[1];
    fVar29 = pfVar1[2] - pfVar4[2];
    fVar30 = pfVar1[3] - pfVar4[3];
    pfVar1 = data + lVar12 + 0x38;
    fVar43 = *pfVar2 + *pfVar1;
    fVar44 = pfVar2[1] + pfVar1[1];
    fVar45 = pfVar2[2] + pfVar1[2];
    fVar46 = pfVar2[3] + pfVar1[3];
    fVar22 = *pfVar2 - *pfVar1;
    fVar23 = pfVar2[1] - pfVar1[1];
    fVar24 = pfVar2[2] - pfVar1[2];
    fVar25 = pfVar2[3] - pfVar1[3];
    pfVar1 = data + lVar12 + 0x30;
    fVar53 = *pfVar3 + *pfVar1;
    fVar54 = pfVar3[1] + pfVar1[1];
    fVar55 = pfVar3[2] + pfVar1[2];
    fVar56 = pfVar3[3] + pfVar1[3];
    fVar32 = *pfVar3 - *pfVar1;
    fVar33 = pfVar3[1] - pfVar1[1];
    fVar34 = pfVar3[2] - pfVar1[2];
    fVar35 = pfVar3[3] - pfVar1[3];
    pfVar1 = data + lVar12 + 0x28;
    fVar36 = *pfVar1;
    fVar42 = pfVar1[1];
    fVar47 = pfVar1[2];
    fVar41 = pfVar1[3];
    fVar57 = fVar21 + fVar36;
    fVar58 = fVar26 + fVar42;
    fVar59 = fVar31 + fVar47;
    fVar60 = fVar52 + fVar41;
    fVar48 = fVar37 + fVar57;
    fVar49 = fVar38 + fVar58;
    fVar50 = fVar39 + fVar59;
    fVar51 = fVar40 + fVar60;
    fVar37 = fVar37 - fVar57;
    fVar38 = fVar38 - fVar58;
    fVar39 = fVar39 - fVar59;
    fVar40 = fVar40 - fVar60;
    fVar57 = fVar43 + fVar53;
    fVar58 = fVar44 + fVar54;
    fVar59 = fVar45 + fVar55;
    fVar60 = fVar46 + fVar56;
    pfVar1 = data + lVar12 + 8;
    *pfVar1 = fVar57 + fVar48;
    pfVar1[1] = fVar58 + fVar49;
    pfVar1[2] = fVar59 + fVar50;
    pfVar1[3] = fVar60 + fVar51;
    pfVar1 = data + lVar12 + 0x28;
    *pfVar1 = fVar48 - fVar57;
    pfVar1[1] = fVar49 - fVar58;
    pfVar1[2] = fVar50 - fVar59;
    pfVar1[3] = fVar51 - fVar60;
    fVar43 = ((fVar43 - fVar53) + fVar37) * 0.70710677;
    fVar44 = ((fVar44 - fVar54) + fVar38) * 0.70710677;
    fVar45 = ((fVar45 - fVar55) + fVar39) * 0.70710677;
    fVar46 = ((fVar46 - fVar56) + fVar40) * 0.70710677;
    pfVar1 = data + lVar12 + 0x18;
    *pfVar1 = fVar37 + fVar43;
    pfVar1[1] = fVar38 + fVar44;
    pfVar1[2] = fVar39 + fVar45;
    pfVar1[3] = fVar40 + fVar46;
    pfVar1 = data + lVar12 + 0x38;
    *pfVar1 = fVar37 - fVar43;
    pfVar1[1] = fVar38 - fVar44;
    pfVar1[2] = fVar39 - fVar45;
    pfVar1[3] = fVar40 - fVar46;
    fVar37 = (fVar21 - fVar36) + fVar32;
    fVar38 = (fVar26 - fVar42) + fVar33;
    fVar39 = (fVar31 - fVar47) + fVar34;
    fVar40 = (fVar52 - fVar41) + fVar35;
    fVar21 = fVar22 + fVar27;
    fVar31 = fVar23 + fVar28;
    fVar36 = fVar24 + fVar29;
    fVar47 = fVar25 + fVar30;
    fVar26 = (fVar37 - fVar21) * 0.38268343;
    fVar52 = (fVar38 - fVar31) * 0.38268343;
    fVar42 = (fVar39 - fVar36) * 0.38268343;
    fVar41 = (fVar40 - fVar47) * 0.38268343;
    fVar37 = fVar37 * 0.5411961 + fVar26;
    fVar38 = fVar38 * 0.5411961 + fVar52;
    fVar39 = fVar39 * 0.5411961 + fVar42;
    fVar40 = fVar40 * 0.5411961 + fVar41;
    fVar26 = fVar21 * 1.306563 + fVar26;
    fVar52 = fVar31 * 1.306563 + fVar52;
    fVar42 = fVar36 * 1.306563 + fVar42;
    fVar41 = fVar47 * 1.306563 + fVar41;
    fVar21 = (fVar32 + fVar22) * 0.70710677;
    fVar31 = (fVar33 + fVar23) * 0.70710677;
    fVar36 = (fVar34 + fVar24) * 0.70710677;
    fVar47 = (fVar35 + fVar25) * 0.70710677;
    fVar22 = fVar27 + fVar21;
    fVar23 = fVar28 + fVar31;
    fVar24 = fVar29 + fVar36;
    fVar25 = fVar30 + fVar47;
    fVar27 = fVar27 - fVar21;
    fVar28 = fVar28 - fVar31;
    fVar29 = fVar29 - fVar36;
    fVar30 = fVar30 - fVar47;
    pfVar1 = data + lVar12 + 0x30;
    *pfVar1 = fVar27 + fVar37;
    pfVar1[1] = fVar28 + fVar38;
    pfVar1[2] = fVar29 + fVar39;
    pfVar1[3] = fVar30 + fVar40;
    pfVar1 = data + lVar12 + 0x20;
    *pfVar1 = fVar27 - fVar37;
    pfVar1[1] = fVar28 - fVar38;
    pfVar1[2] = fVar29 - fVar39;
    pfVar1[3] = fVar30 - fVar40;
    pfVar1 = data + lVar12 + 0x10;
    *pfVar1 = fVar22 + fVar26;
    pfVar1[1] = fVar23 + fVar52;
    pfVar1[2] = fVar24 + fVar42;
    pfVar1[3] = fVar25 + fVar41;
    pfVar1 = data + lVar12 + 0x40;
    *pfVar1 = fVar22 - fVar26;
    pfVar1[1] = fVar23 - fVar52;
    pfVar1[2] = fVar24 - fVar42;
    pfVar1[3] = fVar25 - fVar41;
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_float (FAST_FLOAT * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  FAST_FLOAT tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  FAST_FLOAT tmp10, tmp11, tmp12, tmp13;
  FAST_FLOAT z1, z2, z3, z4, z5, z11, z13;
  FAST_FLOAT *dataptr;
  JSAMPROW elemptr;
  int ctr;

  /* Pass 1: process rows. */

  dataptr = data;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Load data into workspace */
    tmp0 = (FAST_FLOAT) (GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[7]));
    tmp7 = (FAST_FLOAT) (GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[7]));
    tmp1 = (FAST_FLOAT) (GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[6]));
    tmp6 = (FAST_FLOAT) (GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[6]));
    tmp2 = (FAST_FLOAT) (GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[5]));
    tmp5 = (FAST_FLOAT) (GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[5]));
    tmp3 = (FAST_FLOAT) (GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[4]));
    tmp4 = (FAST_FLOAT) (GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[4]));

    /* Even part */

    tmp10 = tmp0 + tmp3;	/* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    /* Apply unsigned->signed conversion */
    dataptr[0] = tmp10 + tmp11 - 8 * CENTERJSAMPLE; /* phase 3 */
    dataptr[4] = tmp10 - tmp11;

    z1 = (tmp12 + tmp13) * ((FAST_FLOAT) 0.707106781); /* c4 */
    dataptr[2] = tmp13 + z1;	/* phase 5 */
    dataptr[6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;	/* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = (tmp10 - tmp12) * ((FAST_FLOAT) 0.382683433); /* c6 */
    z2 = ((FAST_FLOAT) 0.541196100) * tmp10 + z5; /* c2-c6 */
    z4 = ((FAST_FLOAT) 1.306562965) * tmp12 + z5; /* c2+c6 */
    z3 = tmp11 * ((FAST_FLOAT) 0.707106781); /* c4 */

    z11 = tmp7 + z3;		/* phase 5 */
    z13 = tmp7 - z3;

    dataptr[5] = z13 + z2;	/* phase 6 */
    dataptr[3] = z13 - z2;
    dataptr[1] = z11 + z4;
    dataptr[7] = z11 - z4;

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns. */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*7];
    tmp7 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*6];
    tmp6 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*5];
    tmp5 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*4];

    /* Even part */

    tmp10 = tmp0 + tmp3;	/* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[DCTSIZE*0] = tmp10 + tmp11; /* phase 3 */
    dataptr[DCTSIZE*4] = tmp10 - tmp11;

    z1 = (tmp12 + tmp13) * ((FAST_FLOAT) 0.707106781); /* c4 */
    dataptr[DCTSIZE*2] = tmp13 + z1; /* phase 5 */
    dataptr[DCTSIZE*6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;	/* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = (tmp10 - tmp12) * ((FAST_FLOAT) 0.382683433); /* c6 */
    z2 = ((FAST_FLOAT) 0.541196100) * tmp10 + z5; /* c2-c6 */
    z4 = ((FAST_FLOAT) 1.306562965) * tmp12 + z5; /* c2+c6 */
    z3 = tmp11 * ((FAST_FLOAT) 0.707106781); /* c4 */

    z11 = tmp7 + z3;		/* phase 5 */
    z13 = tmp7 - z3;

    dataptr[DCTSIZE*5] = z13 + z2; /* phase 6 */
    dataptr[DCTSIZE*3] = z13 - z2;
    dataptr[DCTSIZE*1] = z11 + z4;
    dataptr[DCTSIZE*7] = z11 - z4;

    dataptr++;			/* advance pointer to next column */
  }
}